

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_ocb.c
# Opt level: O0

void * aes_ocb_newctx(void *provctx,size_t kbits,size_t blkbits,size_t ivbits,uint mode,
                     uint64_t flags)

{
  int iVar1;
  PROV_CIPHER_HW *flags_00;
  void *in_RDX;
  size_t in_RSI;
  undefined4 in_R8D;
  void *in_R9;
  PROV_AES_OCB_CTX *ctx;
  undefined8 in_stack_ffffffffffffff80;
  int line;
  char *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  void *blkbits_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined8 local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = CRYPTO_zalloc(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,line);
    if (local_8 != (void *)0x0) {
      blkbits_00 = local_8;
      flags_00 = ossl_prov_cipher_hw_aes_ocb(in_RSI);
      ossl_cipher_generic_initkey
                (in_RDX,in_RSI,(size_t)blkbits_00,(size_t)in_stack_ffffffffffffff88,0,
                 (uint64_t)flags_00,(PROV_CIPHER_HW *)CONCAT44(in_R8D,in_stack_ffffffffffffffb0),
                 in_R9);
      *(undefined8 *)((long)local_8 + 0x368) = 0x10;
    }
  }
  return local_8;
}

Assistant:

static void *aes_ocb_newctx(void *provctx, size_t kbits, size_t blkbits,
                            size_t ivbits, unsigned int mode, uint64_t flags)
{
    PROV_AES_OCB_CTX *ctx;

    if (!ossl_prov_is_running())
        return NULL;

    ctx = OPENSSL_zalloc(sizeof(*ctx));
    if (ctx != NULL) {
        ossl_cipher_generic_initkey(ctx, kbits, blkbits, ivbits, mode, flags,
                                    ossl_prov_cipher_hw_aes_ocb(kbits), NULL);
        ctx->taglen = OCB_DEFAULT_TAG_LEN;
    }
    return ctx;
}